

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRackpinion::ChLinkRackpinion(ChLinkRackpinion *this)

{
  double dVar1;
  ChVector<double> local_58;
  ChQuaternion<double> local_40;
  
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,true,false,false,false,false,false);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkRackpinion_01168d68;
  this->R = 0.1;
  this->a1 = 0.0;
  this->alpha = 0.0;
  this->beta = 0.0;
  *(undefined8 *)((long)&this->beta + 1) = 0;
  *(undefined8 *)((long)&this->phase + 1) = 0;
  dVar1 = DAT_011dd3e0;
  (this->contact_pt).m_data[0] = VNULL;
  (this->contact_pt).m_data[1] = dVar1;
  (this->contact_pt).m_data[2] = DAT_011dd3e8;
  local_40.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_pinion,&local_58,&local_40);
  local_40.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_rack,&local_58,&local_40);
  ChFrame<double>::SetIdentity(&this->local_pinion);
  ChFrame<double>::SetIdentity(&this->local_rack);
  return;
}

Assistant:

ChLinkRackpinion::ChLinkRackpinion()
    : ChLinkMateGeneric(true, false, false, false, false, false),
      R(0.1),
      alpha(0),
      beta(0),
      phase(0),
      checkphase(false),
      a1(0),
      contact_pt(VNULL) {
    local_pinion.SetIdentity();
    local_rack.SetIdentity();
}